

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

void __thiscall QEvdevTouchScreenData::reportPoints(QEvdevTouchScreenData *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  qsizetype qVar12;
  reference pTVar13;
  QDebug *o;
  QPointingDevice *this_00;
  QList_conflict *pQVar14;
  char *in_RDI;
  long in_FS_OFFSET;
  qreal qVar15;
  qreal qVar16;
  double dVar17;
  qreal qVar18;
  qreal sizeRatio;
  qreal wy;
  qreal wx;
  TouchPoint *tp;
  int i;
  int pointCount;
  int hw_h;
  int hw_w;
  QRect winRect;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffeb8;
  KeyboardModifier in_stack_fffffffffffffebc;
  QRectF *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  QRectF *this_01;
  QDebug *in_stack_fffffffffffffed8;
  QEvdevTouchScreenData *in_stack_fffffffffffffef0;
  int local_d0;
  uint local_b4;
  QDebug local_90;
  undefined1 local_88 [8];
  QDebug local_80;
  QPointF local_78;
  QRectF local_68;
  QRectF local_48;
  QRect local_28;
  qsizetype local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.x2.m_i = -0x55555556;
  local_28.y2.m_i = -0x55555556;
  local_28.x1.m_i = -0x55555556;
  local_28.y1.m_i = -0x55555556;
  local_28 = screenGeometry(in_stack_fffffffffffffef0);
  bVar5 = QRect::isNull((QRect *)in_stack_fffffffffffffec0);
  if (!bVar5) {
    iVar1 = *(int *)(in_RDI + 0x84);
    iVar2 = *(int *)(in_RDI + 0x80);
    iVar3 = *(int *)(in_RDI + 0x8c);
    iVar4 = *(int *)(in_RDI + 0x88);
    qVar12 = QList<QWindowSystemInterface::TouchPoint>::size
                       ((QList<QWindowSystemInterface::TouchPoint> *)(in_RDI + 0x10));
    for (local_d0 = 0; local_d0 < (int)qVar12; local_d0 = local_d0 + 1) {
      pTVar13 = QList<QWindowSystemInterface::TouchPoint>::operator[]
                          ((QList<QWindowSystemInterface::TouchPoint> *)in_stack_fffffffffffffec0,
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar6 = QRect::left((QRect *)0x14e60e);
      qVar15 = QPointF::x(&pTVar13->normalPosition);
      iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar8 = QRect::top((QRect *)0x14e667);
      qVar16 = QPointF::y(&pTVar13->normalPosition);
      iVar9 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar10 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar11 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))
      ;
      dVar17 = (double)(iVar10 + iVar11) / (double)((iVar1 - iVar2) + (iVar3 - iVar4));
      qVar18 = QRectF::width(&pTVar13->area);
      if ((qVar18 != -1.0) || (NAN(qVar18))) {
        qVar18 = QRectF::width(&pTVar13->area);
        in_stack_fffffffffffffed8 = (QDebug *)(qVar18 * dVar17);
        qVar18 = QRectF::height(&pTVar13->area);
        QRectF::QRectF((QRectF *)(local_88 + 0x20),0.0,0.0,(qreal)in_stack_fffffffffffffed8,
                       qVar18 * dVar17);
        (pTVar13->area).xp = local_68.xp;
        (pTVar13->area).yp = local_68.yp;
        (pTVar13->area).w = local_68.w;
        (pTVar13->area).h = local_68.h;
      }
      else {
        QRectF::QRectF((QRectF *)(local_88 + 0x40),0.0,0.0,8.0,8.0);
        (pTVar13->area).xp = local_48.xp;
        (pTVar13->area).yp = local_48.yp;
        (pTVar13->area).w = local_48.w;
        (pTVar13->area).h = local_48.h;
      }
      this_01 = &pTVar13->area;
      QPointF::QPointF((QPointF *)(local_88 + 0x10),qVar15 * (double)(iVar7 + -1) + (double)iVar6,
                       qVar16 * (double)(iVar9 + -1) + (double)iVar8);
      QRectF::moveCenter(in_stack_fffffffffffffec0,
                         (QPointF *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if ((*(int *)(in_RDI + 0x90) == 0) && (*(int *)(in_RDI + 0x94) == 0)) {
        pTVar13->pressure = (double)(pTVar13->state != Released);
      }
      else {
        pTVar13->pressure =
             (pTVar13->pressure - (double)*(int *)(in_RDI + 0x90)) /
             (double)(*(int *)(in_RDI + 0x94) - *(int *)(in_RDI + 0x90));
      }
      qLcEvents();
      bVar5 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x14e8ac);
      if (bVar5) {
        local_18 = -0x5555555555555556;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        qLcEvents();
        anon_unknown.dwarf_1b3959::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffec0,
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                  );
        while (bVar5 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar5) {
          anon_unknown.dwarf_1b3959::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x14e90f);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)this_01,in_stack_fffffffffffffec8,
                     (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (char *)0x14e928);
          QMessageLogger::debug();
          o = QDebug::operator<<(in_stack_fffffffffffffed8,in_RDI);
          QDebug::QDebug((QDebug *)local_88,o);
          ::operator<<((QDebug *)(local_88 + 8),(TouchPoint *)local_88);
          QDebug::~QDebug((QDebug *)(local_88 + 8));
          QDebug::~QDebug((QDebug *)local_88);
          QDebug::~QDebug(&local_90);
          local_10 = local_10 & 0xffffffffffffff00;
        }
      }
    }
    if ((in_RDI[0x150] & 1U) == 0) {
      this_00 = QEvdevTouchScreenHandler::touchDevice(*(QEvdevTouchScreenHandler **)in_RDI);
      pQVar14 = (QList_conflict *)(in_RDI + 0x10);
      QFlags<Qt::KeyboardModifier>::QFlags
                ((QFlags<Qt::KeyboardModifier> *)this_00,in_stack_fffffffffffffebc);
      QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
                ((QWindow *)0x0,this_00,pQVar14,(QFlags_conflict *)(ulong)local_b4);
    }
    else {
      QEvdevTouchScreenHandler::touchPointsUpdated((QEvdevTouchScreenHandler *)0x14e9de);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTouchScreenData::reportPoints()
{
    QRect winRect = screenGeometry();
    if (winRect.isNull())
        return;

    const int hw_w = hw_range_x_max - hw_range_x_min;
    const int hw_h = hw_range_y_max - hw_range_y_min;

    // Map the coordinates based on the normalized position. QPA expects 'area'
    // to be in screen coordinates.
    const int pointCount = m_touchPoints.size();
    for (int i = 0; i < pointCount; ++i) {
        QWindowSystemInterface::TouchPoint &tp(m_touchPoints[i]);

        // Generate a screen position that is always inside the active window
        // or the primary screen.  Even though we report this as a QRectF, internally
        // Qt uses QRect/QPoint so we need to bound the size to winRect.size() - QSize(1, 1)
        const qreal wx = winRect.left() + tp.normalPosition.x() * (winRect.width() - 1);
        const qreal wy = winRect.top() + tp.normalPosition.y() * (winRect.height() - 1);
        const qreal sizeRatio = (winRect.width() + winRect.height()) / qreal(hw_w + hw_h);
        if (tp.area.width() == -1) // touch major was not provided
            tp.area = QRectF(0, 0, 8, 8);
        else
            tp.area = QRectF(0, 0, tp.area.width() * sizeRatio, tp.area.height() * sizeRatio);
        tp.area.moveCenter(QPointF(wx, wy));

        // Calculate normalized pressure.
        if (!hw_pressure_min && !hw_pressure_max)
            tp.pressure = tp.state == QEventPoint::State::Released ? 0 : 1;
        else
            tp.pressure = (tp.pressure - hw_pressure_min) / qreal(hw_pressure_max - hw_pressure_min);

        if (Q_UNLIKELY(qLcEvents().isDebugEnabled()))
            qCDebug(qLcEvents) << "reporting" << tp;
    }

    // Let qguiapp pick the target window.
    if (m_filtered)
        emit q->touchPointsUpdated();
    else
        QWindowSystemInterface::handleTouchEvent(nullptr, q->touchDevice(), m_touchPoints);
}